

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum.hpp
# Opt level: O3

void __thiscall
ranges::
partial_sum_view<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>,_std::plus<void>_>
::cursor<false>::next(cursor<false> *this)

{
  size_t sVar1;
  int *piVar2;
  undefined1 *__nbytes;
  void *__buf;
  variant<int_*,_int_*> *pvVar3;
  anon_union_8_2_3194c211_for_type_0 aVar4;
  variant_visit_results_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>::next_fun,_int_*,_int_*>
  res;
  undefined1 auStack_28 [8];
  undefined8 local_20;
  
  __nbytes = auStack_28;
  aVar4 = (anon_union_8_2_3194c211_for_type_0)
          ((this->parent_->base_).rngs_.
           super__Tuple_impl<0UL,_ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>
           .super__Tuple_impl<1UL,_ranges::ref_view<std::array<int,_12UL>_>_>.
           super__Head_base<1UL,_ranges::ref_view<std::array<int,_12UL>_>,_false>._M_head_impl.rng_
          + 1);
  sVar1 = *(size_t *)
           ((long)&(this->current_).
                   super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
                   .
                   super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void>
                   .
                   super_mixin_base_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
                   .
                   super_box<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                   .value.its_ + 8);
  if ((sVar1 == 1) &&
     ((this->current_).
      super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
      .
      super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void>
      .
      super_mixin_base_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
      .
      super_box<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
      .value.its_.super_variant_data<int_*,_int_*>.field_0 == aVar4)) {
    __assert_fail("current_ != last",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/furkankirac[P]cs321-2020-21-fall/range-v3/include/range/v3/view/partial_sum.hpp"
                  ,0x79,
                  "void ranges::partial_sum_view<ranges::concat_view<ranges::single_view<int>, ranges::ref_view<std::array<int, 12>>>, std::plus<void>>::cursor<false>::next() [Rng = ranges::concat_view<ranges::single_view<int>, ranges::ref_view<std::array<int, 12>>>, Fun = std::plus<void>, IsConst = false]"
                 );
  }
  pvVar3 = &(this->current_).
            super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
            .
            super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void>
            .
            super_mixin_base_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
            .
            super_box<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
            .value.its_;
  local_20 = 0xffffffffffffffff;
  detail::
  variant_visit_<ranges::detail::variant_data_<meta::list<ranges::detail::indexed_datum<int*,std::integral_constant<unsigned_long,0ul>>,ranges::detail::indexed_datum<int*,std::integral_constant<unsigned_long,1ul>>>,true>::type,ranges::detail::variant_visitor<ranges::concat_view<ranges::single_view<int>,ranges::ref_view<std::array<int,12ul>>>::cursor<false>::next_fun,ranges::variant<void,void>>,ranges::detail::indexed_element_fn>
            (sVar1,pvVar3,&this->current_);
  if ((*(size_t *)
        ((long)&(this->current_).
                super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
                .
                super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void>
                .
                super_mixin_base_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
                .
                super_box<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                .value.its_ + 8) != 1) ||
     ((this->current_).
      super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
      .
      super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void>
      .
      super_mixin_base_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
      .
      super_box<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
      .value.its_.super_variant_data<int_*,_int_*>.field_0 != aVar4)) {
    piVar2 = (int *)concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>
                    ::cursor<false>::read
                              ((cursor<false> *)&this->current_,(int)pvVar3,__buf,(size_t)__nbytes);
    this->sum_ = this->sum_ + *piVar2;
  }
  return;
}

Assistant:

constexpr void next()
            {
                auto last = ranges::end(parent_->base_);
                RANGES_EXPECT(current_ != last);
                if(++current_ != last)
                {
                    auto & sum = static_cast<range_value_t<Rng> &>(sum_);
                    using F = meta::const_if_c<IsConst, Fun>;
                    auto & f = static_cast<F &>(parent_->fun_);
                    sum = invoke(f, sum, *current_);
                }
            }